

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O2

size_t bin_text_write(io_buf *io,char *data,size_t len,stringstream *msg,bool text)

{
  size_t sVar1;
  undefined3 in_register_00000081;
  char *local_58 [4];
  string local_38 [8];
  size_t local_30;
  
  if (CONCAT31(in_register_00000081,text) != 0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    sVar1 = io_buf::bin_write_fixed(io,local_58[0],local_30);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::string((string *)local_58,"",(allocator *)local_38);
    std::__cxx11::stringbuf::str((string *)(msg + 0x18));
    std::__cxx11::string::~string((string *)local_58);
    return sVar1;
  }
  sVar1 = bin_write(io,data,(uint32_t)len);
  return sVar1;
}

Assistant:

inline size_t bin_text_write(io_buf& io, char* data, size_t len, std::stringstream& msg, bool text)
{
  if (text)
  {
    size_t temp = io.bin_write_fixed(msg.str().c_str(), msg.str().size());
    msg.str("");
    return temp;
  }
  else
    return bin_write(io, data, (uint32_t)len);
  return 0;
}